

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QVariant * __thiscall
QFileSystemModel::myComputer(QVariant *__return_storage_ptr__,QFileSystemModel *this,int role)

{
  QAbstractFileIconProvider *pQVar1;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 1) {
    pQVar1 = QFileInfoGatherer::iconProvider
                       (*(QFileInfoGatherer **)(*(long *)&this->field_0x8 + 0xe0));
    if (pQVar1 != (QAbstractFileIconProvider *)0x0) {
      (*pQVar1->_vptr_QAbstractFileIconProvider[2])(&local_30,pQVar1,0);
      QIcon::operator_cast_to_QVariant(__return_storage_ptr__,(QIcon *)&local_30);
      QIcon::~QIcon((QIcon *)&local_30);
      goto LAB_006208f3;
    }
  }
  else if (role == 0) {
    QMetaObject::tr((char *)&local_30,(char *)&staticMetaObject,0x6d762f);
    ::QVariant::QVariant(__return_storage_ptr__,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_006208f3;
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_006208f3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QFileSystemModel::myComputer(int role) const
{
#if QT_CONFIG(filesystemwatcher)
    Q_D(const QFileSystemModel);
#endif
    switch (role) {
    case Qt::DisplayRole:
        return QFileSystemModelPrivate::myComputer();
#if QT_CONFIG(filesystemwatcher)
    case Qt::DecorationRole:
        if (auto *provider = d->fileInfoGatherer->iconProvider())
            return provider->icon(QAbstractFileIconProvider::Computer);
    break;
#endif
    }
    return QVariant();
}